

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall
dgMeshEffect::dgMeshEffect
          (dgMeshEffect *this,HaF64 *vertexCloud,HaI32 count,HaI32 strideInByte,HaF64 distTol)

{
  dgBigVector *pdVar1;
  dgVertexAtribute *pdVar2;
  HaF32 *vertex;
  HaI32 *faceIndexCount;
  HaI32 *faceMaterialIndex;
  HaI32 *vertexIndex;
  HaI32 *normalIndex;
  HaI32 *pHVar3;
  char *__function;
  HaI32 *pHVar4;
  HaF32 *pHVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  HaF32 local_98 [4];
  dgVector normal;
  dgConvexHull3d convexHull;
  
  dgPolyhedra::dgPolyhedra(&this->super_dgPolyhedra);
  (this->super_dgRefCounter).m_refCount = 1;
  (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>._vptr_dgTree =
       (_func_int **)&PTR__dgMeshEffect_00b6abf0;
  (this->super_dgRefCounter)._vptr_dgRefCounter = (_func_int **)&DAT_00b6ac10;
  *(undefined8 *)&(this->super_dgRefCounter).field_0xc = 0x800000000;
  this->m_atribCount = 0;
  this->m_maxAtribCount = 8;
  this->m_points = (dgBigVector *)0x0;
  this->m_attib = (dgVertexAtribute *)0x0;
  pdVar1 = (dgBigVector *)malloc(0x100);
  this->m_points = pdVar1;
  pdVar2 = (dgVertexAtribute *)malloc(0x300);
  this->m_attib = pdVar2;
  if (3 < count) {
    dgConvexHull3d::dgConvexHull3d(&convexHull,vertexCloud,strideInByte,count,distTol,0x7fffffff);
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count != 0) {
      vertex = (HaF32 *)malloc((long)(convexHull.m_count << 4));
      if (convexHull.m_count < 0) {
        __function = "T &dgStack<dgVector>::operator[](hacd::HaI32) [T = dgVector]";
LAB_0088ce11:
        __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                      ,0x60,__function);
      }
      if ((ulong)(uint)convexHull.m_count != 0) {
        pHVar5 = vertex + 3;
        uVar6 = 0;
        do {
          pdVar1 = dgArray<dgBigVector>::operator[](&convexHull.m_points,(HaI32)uVar6);
          fVar7 = (float)(pdVar1->super_dgTemplateVector<double>).m_x;
          fVar8 = (float)(pdVar1->super_dgTemplateVector<double>).m_y;
          fVar9 = (float)(pdVar1->super_dgTemplateVector<double>).m_z;
          fVar10 = (float)(pdVar1->super_dgTemplateVector<double>).m_w;
          if ((((0x7f7fffff < (uint)ABS(fVar7)) || (0x7f7fffff < (uint)ABS(fVar8))) || (NAN(fVar8)))
             || (((0x7f7fffff < (uint)ABS(fVar9) || (NAN(fVar9))) ||
                 ((0x7f7fffff < (uint)ABS(fVar10) || (NAN(fVar10))))))) {
            __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                          ,0x12d,"dgVector::dgVector(const dgBigVector &)");
          }
          pHVar5[-3] = (HaF32)fVar7;
          pHVar5[-2] = (HaF32)fVar8;
          pHVar5[-1] = (HaF32)fVar9;
          *pHVar5 = (HaF32)fVar10;
          uVar6 = uVar6 + 1;
          pHVar5 = pHVar5 + 4;
        } while ((uint)convexHull.m_count != uVar6);
      }
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      normal.super_dgTemplateVector<float>.m_x = 0.0;
      normal.super_dgTemplateVector<float>.m_y = 1.0;
      normal.super_dgTemplateVector<float>.m_z = 0.0;
      normal.super_dgTemplateVector<float>.m_w = 0.0;
      faceIndexCount =
           (HaI32 *)malloc((long)(convexHull.super_dgList<dgConvexHull3DFace>.m_count * 4));
      faceMaterialIndex =
           (HaI32 *)malloc((long)(convexHull.super_dgList<dgConvexHull3DFace>.m_count * 4));
      vertexIndex = (HaI32 *)malloc((long)(convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc
                                          ));
      normalIndex = (HaI32 *)malloc((long)(convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc
                                          ));
      if (convexHull.super_dgList<dgConvexHull3DFace>.m_count < 0) {
        __function = "T &dgStack<int>::operator[](hacd::HaI32) [T = int]";
        goto LAB_0088ce11;
      }
      memset(faceMaterialIndex,0,
             (ulong)(uint)convexHull.super_dgList<dgConvexHull3DFace>.m_count * 4);
      memset(normalIndex,0,(ulong)(uint)convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc);
      if (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0) {
        pHVar3 = vertexIndex + 2;
        pHVar4 = faceIndexCount;
        do {
          *pHVar4 = 3;
          pHVar3[-2] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[0];
          pHVar3[-1] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[1];
          *pHVar3 = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[2];
          convexHull.super_dgList<dgConvexHull3DFace>.m_first =
               (convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_next;
          pHVar3 = pHVar3 + 3;
          pHVar4 = pHVar4 + 1;
        } while (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0);
      }
      BuildFromVertexListIndexList
                (this,convexHull.super_dgList<dgConvexHull3DFace>.m_count,faceIndexCount,
                 faceMaterialIndex,vertex,0x10,vertexIndex,(HaF32 *)&normal,0x10,normalIndex,
                 local_98,0x10,normalIndex,local_98,0x10,normalIndex);
      free(normalIndex);
      free(vertexIndex);
      free(faceMaterialIndex);
      free(faceIndexCount);
      free(vertex);
    }
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  return;
}

Assistant:

dgMeshEffect::dgMeshEffect (const hacd::HaF64* const vertexCloud, hacd::HaI32 count, hacd::HaI32 strideInByte, hacd::HaF64 distTol)
:dgPolyhedra()
{
	Init(true);
	if (count >= 4) {
		dgConvexHull3d convexHull (vertexCloud, strideInByte, count, distTol);
		if (convexHull.GetCount()) {

			hacd::HaI32 vertexCount = convexHull.GetVertexCount();
			dgStack<dgVector> pointsPool (convexHull.GetVertexCount());
			dgVector* const points = &pointsPool[0];
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
				points[i] = convexHull.GetVertex(i);
			}
			dgVector uv(hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
			dgVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

			hacd::HaI32 triangleCount = convexHull.GetCount();
			dgStack<hacd::HaI32> faceCountPool (triangleCount);
			dgStack<hacd::HaI32> materialsPool (triangleCount);
			dgStack<hacd::HaI32> vertexIndexListPool (triangleCount * 3);
			dgStack<hacd::HaI32> normalIndexListPool (triangleCount * 3);


			memset (&materialsPool[0], 0, triangleCount * sizeof (hacd::HaI32));
			memset (&normalIndexListPool[0], 0, 3 * triangleCount * sizeof (hacd::HaI32));

			hacd::HaI32 index = 0;
			hacd::HaI32* const faceCount = &faceCountPool[0];
			hacd::HaI32* const vertexIndexList = &vertexIndexListPool[0];
			for (dgConvexHull3d::dgListNode* faceNode = convexHull.GetFirst(); faceNode; faceNode = faceNode->GetNext()) {
				dgConvexHull3DFace& face = faceNode->GetInfo();
				faceCount[index] = 3;
				vertexIndexList[index * 3 + 0] = face.m_index[0]; 
				vertexIndexList[index * 3 + 1] = face.m_index[1]; 
				vertexIndexList[index * 3 + 2] = face.m_index[2]; 
				index ++;
			}

			BuildFromVertexListIndexList(triangleCount, faceCount, &materialsPool[0], 
				&points[0].m_x, sizeof (dgVector), vertexIndexList,
				&normal.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0]);
		}
	}
}